

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O2

bool __thiscall features::Surf::descriptor_orientation(Surf *this,Descriptor *descr)

{
  float *dy_00;
  float fVar1;
  float __x;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  Descriptor *pDVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int i;
  int iVar12;
  int iVar13;
  int iVar14;
  int x;
  int rx;
  int iVar15;
  float *dx_00;
  float fVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  float local_428 [2];
  float dx [109];
  float local_268 [2];
  float dy [109];
  double local_a8;
  double local_98;
  double local_88;
  double local_78;
  
  iVar13 = (int)(descr->x + 0.5);
  iVar14 = (int)(descr->y + 0.5);
  iVar12 = (int)descr->scale;
  peVar2 = (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar9 = iVar12 * 8;
  bVar3 = iVar13 + iVar12 * 8 + 1 < (peVar2->super_TypedImageBase<long>).super_ImageBase.w;
  bVar4 = iVar14 + iVar12 * 8 + 1 < (peVar2->super_TypedImageBase<long>).super_ImageBase.h;
  if (bVar4 && (bVar3 && (iVar9 < iVar14 && iVar9 < iVar13))) {
    stack0xffffffffffffff50 = descr;
    iVar10 = 0;
    for (iVar8 = -5; pDVar7 = stack0xffffffffffffff50, iVar8 != 6; iVar8 = iVar8 + 1) {
      x = iVar13 + iVar12 * -5;
      for (iVar15 = -5; iVar15 != 6; iVar15 = iVar15 + 1) {
        if ((uint)(iVar15 * iVar15 + iVar8 * iVar8) < 0x24) {
          lVar11 = (long)iVar10;
          dx_00 = local_428 + lVar11;
          dy_00 = local_268 + lVar11;
          filter_dx_dy(this,x,iVar8 * iVar12 + iVar14,iVar12 * 2,dx_00,dy_00);
          fVar1 = *(float *)(&DAT_001234b0 + lVar11 * 4);
          *dx_00 = *dx_00 * fVar1;
          *dy_00 = fVar1 * *dy_00;
          iVar10 = iVar10 + 1;
        }
        x = x + iVar12;
      }
    }
    local_a8 = 0.0;
    local_88 = 0.0;
    local_98 = 0.0;
    for (dVar18 = -3.141592653589793; dVar18 < 3.141592653589793;
        dVar18 = dVar18 + 0.39269908169872414) {
      dVar5 = dVar18 + -0.5235987755982988;
      dVar6 = dVar18 + 0.5235987755982988;
      dVar19 = 0.0;
      local_78 = 0.0;
      for (lVar11 = 0; lVar11 != 0x6d; lVar11 = lVar11 + 1) {
        fVar1 = local_268[lVar11];
        __x = local_428[lVar11];
        fVar16 = atan2f(fVar1,__x);
        dVar17 = (double)fVar16;
        if ((((dVar5 < dVar17) && (dVar17 < dVar6)) ||
            ((dVar5 < dVar17 + 6.283185307179586 && (dVar17 + 6.283185307179586 < dVar6)))) ||
           ((dVar5 < dVar17 + -6.283185307179586 && (dVar17 + -6.283185307179586 < dVar6)))) {
          dVar19 = dVar19 + (double)__x;
          local_78 = local_78 + (double)fVar1;
        }
      }
      dVar5 = dVar19 * dVar19 + local_78 * local_78;
      if (dVar5 <= local_88) {
        dVar19 = local_98;
      }
      local_a8 = (double)(~-(ulong)(local_88 < dVar5) & (ulong)local_a8 |
                         (ulong)local_78 & -(ulong)(local_88 < dVar5));
      if (dVar5 <= local_88) {
        dVar5 = local_88;
      }
      local_98 = dVar19;
      local_88 = dVar5;
    }
    dVar18 = atan2(local_a8,local_98);
    pDVar7->orientation = (float)dVar18;
  }
  return bVar4 && (bVar3 && (iVar9 < iVar14 && iVar9 < iVar13));
}

Assistant:

bool
Surf::descriptor_orientation (Descriptor* descr)
{
    int const descr_x = static_cast<int>(descr->x + 0.5f);
    int const descr_y = static_cast<int>(descr->y + 0.5f);
    int const descr_scale = static_cast<int>(descr->scale);
    int const width = this->sat->width();
    int const height = this->sat->height();

    /*
     * Pre-computed gaussian weights for the (circular) window. The gaussian
     * is computed as exp((dx^2 + dy^2) / (2 * sigma^2) with sigma = 2.5.
     */
    float const gaussian[109] = { 0.0658748, 0.0982736, 0.12493, 0.135335,
        0.12493, 0.0982736, 0.0658748, 0.0773047, 0.135335, 0.201897, 0.256661,
        0.278037, 0.256661, 0.201897, 0.135335, 0.0773047, 0.0658748, 0.135335,
        0.236928, 0.353455, 0.449329, 0.486752, 0.449329, 0.353455, 0.236928,
        0.135335, 0.0658748, 0.0982736, 0.201897, 0.353455, 0.527292, 0.67032,
        0.726149, 0.67032, 0.527292, 0.353455, 0.201897, 0.0982736, 0.12493,
        0.256661, 0.449329, 0.67032, 0.852144, 0.923116, 0.852144, 0.67032,
        0.449329, 0.256661, 0.12493, 0.135335, 0.278037, 0.486752, 0.726149,
        0.923116, 1, 0.923116, 0.726149, 0.486752, 0.278037, 0.135335, 0.12493,
        0.256661, 0.449329, 0.67032, 0.852144, 0.923116, 0.852144, 0.67032,
        0.449329, 0.256661, 0.12493, 0.0982736, 0.201897, 0.353455, 0.527292,
        0.67032, 0.726149, 0.67032, 0.527292, 0.353455, 0.201897, 0.0982736,
        0.0658748, 0.135335, 0.236928, 0.353455, 0.449329, 0.486752, 0.449329,
        0.353455, 0.236928, 0.135335, 0.0658748, 0.0773047, 0.135335, 0.201897,
        0.256661, 0.278037, 0.256661, 0.201897, 0.135335, 0.0773047, 0.0658748,
        0.0982736, 0.12493, 0.135335, 0.12493, 0.0982736, 0.0658748 };

    /*
     * At least a 12 * scale pixel kernel for the support circle is needed.
     * Additionally, computing the Haar Wavelet response uses a kernel size
     * of 4 * scale pixel. That makes a total of (6 + 2) * scale pixel on
     * either side of the kernel spacing. One additional pixel is needed
     * to the upper-left side to simplify integral image access.
     */
    int const spacing = 8 * descr_scale + 1;
    if (descr_x < spacing || descr_y < spacing
        || descr_x + spacing >= width || descr_y + spacing >= height)
        return false;

    /* The number of samples is constant, depending on radius. */
#define NUM_SAMPLES 109
    float dx[NUM_SAMPLES], dy[NUM_SAMPLES];

    /*
     * Iterate over the pixels of a circle with radius 6 * scale
     * and compute Haar Wavelet responses in x- and y-direction.
     */
    for (int ry = -5, index = 0; ry <= 5; ++ry)
        for (int rx = -5; rx <= 5; ++rx)
        {
            if (rx * rx + ry * ry >= 36)
                continue;
            this->filter_dx_dy(descr_x + rx * descr_scale,
                descr_y + ry * descr_scale, 2 * descr_scale,
                dx + index, dy + index);
            dx[index] *= gaussian[index];
            dy[index] *= gaussian[index];
            index += 1;
        }

    /*
     * Iterate in a sliding window over the 109 extracted samples
     * in order to find a dominant orientation for the keypoint.
     */
    double const window_increment = MATH_PI / 8.0;
    double const window_halfsize = MATH_PI / 6.0;
    double best_dx = 0.0, best_dy = 0.0;
    double best_length = 0.0f;
    for (double deg = -MATH_PI; deg < MATH_PI; deg += window_increment)
    {
        /* Evaluate samples for this window. */
        double const win_start = deg - window_halfsize;
        double const win_end = deg + window_halfsize;
        double sum_dx = 0.0f, sum_dy = 0.0f;
        for (int i = 0; i < NUM_SAMPLES; ++i)
        {
            double const sample_deg = std::atan2(dy[i], dx[i]);
            double const sample_deg_p = sample_deg + 2.0 * MATH_PI;
            double const sample_deg_m = sample_deg - 2.0 * MATH_PI;
            if ((sample_deg > win_start && sample_deg < win_end)
                || (sample_deg_p > win_start && sample_deg_p < win_end)
                || (sample_deg_m > win_start && sample_deg_m < win_end))
            {
                sum_dx += dx[i];
                sum_dy += dy[i];
            }
        }

        /* Total vector length of dx/dy sums defines dominance. */
        double const length = sum_dx * sum_dx + sum_dy * sum_dy;
        if (length > best_length)
        {
            best_dx = sum_dx;
            best_dy = sum_dy;
            best_length = length;
        }
    }

    /* TODO: Threshold on the vector length? */
    descr->orientation = std::atan2(best_dy, best_dx);
    return true;
}